

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O2

void __thiscall ReplayingHammerer::ReplayingHammerer(ReplayingHammerer *this,Memory *mem)

{
  uint uVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2728;
  undefined1 local_13a0 [8];
  random_device rd;
  
  this->mem = mem;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->gen);
  (this->map_mapping_id_to_pattern)._M_h._M_buckets =
       &(this->map_mapping_id_to_pattern)._M_h._M_single_bucket;
  (this->map_mapping_id_to_pattern)._M_h._M_bucket_count = 1;
  (this->map_mapping_id_to_pattern)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map_mapping_id_to_pattern)._M_h._M_element_count = 0;
  (this->map_mapping_id_to_pattern)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map_mapping_id_to_pattern)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map_mapping_id_to_pattern)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->initial_hammering_num_reps = 0x32;
  this->hammering_num_reps = 0x32;
  FuzzingParameterSet::FuzzingParameterSet(&this->params);
  std::random_device::random_device((random_device *)local_13a0);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_2728,(ulong)uVar1);
  memcpy(&this->gen,&local_2728,5000);
  std::random_device::~random_device((random_device *)local_13a0);
  return;
}

Assistant:

ReplayingHammerer::ReplayingHammerer(Memory &mem) : mem(mem) { /* NOLINT */
  std::random_device rd;
  gen = std::mt19937(rd());
}